

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_prefix_coding.cpp
# Opt level: O0

bool lzham::prefix_coding::limit_max_code_size(uint num_syms,uint8 *pCodesizes,uint max_code_size)

{
  uint uVar1;
  uint uVar2;
  uint in_EDX;
  long in_RSI;
  uint in_EDI;
  uint next_ofs;
  uint c_1;
  uint i_6;
  uint n;
  uint i_5;
  uint8 *p;
  uint8 new_codesizes [1024];
  uint i_4;
  uint i_3;
  uint total;
  uint i_2;
  uint i_1;
  uint next_sorted_ofs [35];
  uint ofs;
  uint c;
  uint i;
  bool should_limit;
  uint num_codes [35];
  uint cMaxEverCodeSize;
  uint local_57c;
  uint local_574;
  undefined1 *local_570;
  undefined1 local_568 [1036];
  uint local_15c;
  uint local_158;
  int local_154;
  uint local_150;
  uint local_14c;
  uint auStack_148 [36];
  uint local_b8;
  uint local_b4;
  uint local_b0;
  char local_a9;
  uint local_a8 [36];
  undefined4 local_18;
  uint local_14;
  long local_10;
  uint local_8;
  bool local_1;
  
  local_18 = 0x22;
  if ((((in_EDI == 0) || (0x400 < in_EDI)) || (in_EDX == 0)) || (0x22 < in_EDX)) {
    local_1 = false;
  }
  else {
    local_14 = in_EDX;
    local_10 = in_RSI;
    local_8 = in_EDI;
    utils::zero_object<unsigned_int[35]>((uint (*) [35])0x1260bd);
    local_a9 = '\0';
    for (local_b0 = 0; local_b0 < local_8; local_b0 = local_b0 + 1) {
      local_b4 = (uint)*(byte *)(local_10 + (ulong)local_b0);
      local_a8[local_b4] = local_a8[local_b4] + 1;
      if (local_14 < local_b4) {
        local_a9 = '\x01';
      }
    }
    if (local_a9 == '\0') {
      local_1 = true;
    }
    else {
      local_b8 = 0;
      for (local_14c = 1; local_14c < 0x23; local_14c = local_14c + 1) {
        auStack_148[local_14c] = local_b8;
        local_b8 = local_a8[local_14c] + local_b8;
      }
      if ((local_b8 < 2) || (0x400 < local_b8)) {
        local_1 = true;
      }
      else if ((uint)(1 << ((byte)local_14 & 0x1f)) < local_b8) {
        local_1 = false;
      }
      else {
        for (local_150 = local_14 + 1; local_150 < 0x23; local_150 = local_150 + 1) {
          local_a8[local_14] = local_a8[local_150] + local_a8[local_14];
        }
        local_154 = 0;
        for (local_158 = local_14; local_158 != 0; local_158 = local_158 - 1) {
          local_154 = (local_a8[local_158] << ((byte)local_14 - (char)local_158 & 0x1f)) + local_154
          ;
        }
        if (local_154 == 1 << ((byte)local_14 & 0x1f)) {
          local_1 = true;
        }
        else {
          do {
            local_a8[local_14] = local_a8[local_14] - 1;
            for (local_15c = local_14 - 1; local_15c != 0; local_15c = local_15c - 1) {
              if (local_a8[local_15c] != 0) {
                local_a8[local_15c] = local_a8[local_15c] - 1;
                local_a8[local_15c + 1] = local_a8[local_15c + 1] + 2;
                break;
              }
            }
            if (local_15c == 0) {
              return false;
            }
            local_154 = local_154 + -1;
          } while (local_154 != 1 << ((byte)local_14 & 0x1f));
          local_570 = local_568;
          for (local_574 = 1; local_574 <= local_14; local_574 = local_574 + 1) {
            uVar2 = local_a8[local_574];
            if (uVar2 != 0) {
              memset(local_570,local_574 & 0xff,(ulong)uVar2);
              local_570 = local_570 + uVar2;
            }
          }
          for (local_57c = 0; local_57c < local_8; local_57c = local_57c + 1) {
            uVar2 = (uint)*(byte *)(local_10 + (ulong)local_57c);
            if (uVar2 != 0) {
              uVar1 = auStack_148[uVar2];
              auStack_148[uVar2] = uVar1 + 1;
              *(undefined1 *)(local_10 + (ulong)local_57c) = local_568[uVar1];
            }
          }
          local_1 = true;
        }
      }
    }
  }
  return local_1;
}

Assistant:

bool limit_max_code_size(uint num_syms, uint8* pCodesizes, uint max_code_size)
      {
         const uint cMaxEverCodeSize = 34;            
         
         if ((!num_syms) || (num_syms > cMaxSupportedSyms) || (max_code_size < 1) || (max_code_size > cMaxEverCodeSize))
         {
            LZHAM_LOG_ERROR(3000);
            return false;
         }
         
         uint num_codes[cMaxEverCodeSize + 1];
         utils::zero_object(num_codes);

         bool should_limit = false;
         
         for (uint i = 0; i < num_syms; i++)
         {
            uint c = pCodesizes[i];
            
            LZHAM_ASSERT(c <= cMaxEverCodeSize);
            
            num_codes[c]++;
            if (c > max_code_size)
               should_limit = true;
         }
         
         if (!should_limit)
            return true;
         
         uint ofs = 0;
         uint next_sorted_ofs[cMaxEverCodeSize + 1];
         for (uint i = 1; i <= cMaxEverCodeSize; i++)
         {
            next_sorted_ofs[i] = ofs;
            ofs += num_codes[i];
         }
            
         if ((ofs < 2) || (ofs > cMaxSupportedSyms))
            return true;
         
         if (ofs > (1U << max_code_size))
         {
            LZHAM_LOG_ERROR(3001);
            return false;
         }
                           
         for (uint i = max_code_size + 1; i <= cMaxEverCodeSize; i++)
            num_codes[max_code_size] += num_codes[i];
         
         // Technique of adjusting tree to enforce maximum code size from LHArc. 
			// (If you remember what LHArc was, you've been doing this for a LONG time.)
         
         uint total = 0;
         for (uint i = max_code_size; i; --i)
            total += (num_codes[i] << (max_code_size - i));

         if (total == (1U << max_code_size))  
            return true;
            
         do
         {
            num_codes[max_code_size]--;

            uint i;
            for (i = max_code_size - 1; i; --i)
            {
               if (!num_codes[i])
                  continue;
               num_codes[i]--;          
               num_codes[i + 1] += 2;   
               break;
            }
            if (!i)
            {
               LZHAM_LOG_ERROR(3002);
               return false;
            }

            total--;   
         } while (total != (1U << max_code_size));
         
         uint8 new_codesizes[cMaxSupportedSyms];
         uint8* p = new_codesizes;
         for (uint i = 1; i <= max_code_size; i++)
         {
            uint n = num_codes[i];
            if (n)
            {
               memset(p, i, n);
               p += n;
            }
         }
                                             
         for (uint i = 0; i < num_syms; i++)
         {
            const uint c = pCodesizes[i];
            if (c)
            {
               uint next_ofs = next_sorted_ofs[c];
               next_sorted_ofs[c] = next_ofs + 1;
            
               pCodesizes[i] = static_cast<uint8>(new_codesizes[next_ofs]);
            }
         }
            
         return true;
      }